

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_as_strings.h
# Opt level: O3

string * join_as_strings<ezy::detail::drop_while_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,std::vector<int,std::allocator<int>>>,____C_A_T_C_H____T_E_S_T____141()::__0>&>
                   (string *__return_storage_ptr__,
                   drop_while_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_titapo[P]ezy_tests_algorithm_cc:764:41)>
                   *range,string_view separator)

{
  reference pvVar1;
  int *piVar2;
  int *piVar3;
  string *psVar4;
  string *extraout_RAX;
  string *psVar5;
  int *piVar6;
  int *piVar7;
  string *t;
  bool bVar8;
  string local_50;
  
  pvVar1 = (range->range).t;
  piVar2 = (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar3 = (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar6 = piVar2;
  do {
    piVar7 = piVar6;
    if (*piVar7 == 5) break;
    piVar6 = piVar7 + 1;
  } while (piVar7 != piVar3);
  if (piVar7 == piVar3) {
    psVar5 = (string *)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)psVar5;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    do {
      piVar6 = piVar2;
      if (*piVar6 == 5) break;
      piVar2 = piVar6 + 1;
    } while (piVar6 != piVar3);
    ezy::to_string_fn::operator()
              (__return_storage_ptr__,(to_string_fn *)&ezy::cpo::to_string,piVar6);
    pvVar1 = (range->range).t;
    psVar4 = (string *)
             (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_finish;
    psVar5 = (string *)
             (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    do {
      t = (string *)((long)&(psVar5->_M_dataplus)._M_p + 4);
      if (*(int *)&(psVar5->_M_dataplus)._M_p == 5) break;
      bVar8 = psVar5 != psVar4;
      psVar5 = t;
    } while (bVar8);
    if (t != psVar4) {
      do {
        ezy::to_string_fn::operator()(&local_50,(to_string_fn *)&ezy::cpo::to_string,(int *)t);
        std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)separator._M_str);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
        psVar5 = (string *)&local_50.field_2;
        if ((string *)local_50._M_dataplus._M_p != psVar5) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          psVar5 = extraout_RAX;
        }
        t = (string *)((long)&(t->_M_dataplus)._M_p + 4);
      } while (t != psVar4);
    }
  }
  return psVar5;
}

Assistant:

std::string
join_as_strings(Range&& range, std::string_view separator = "")
{
  return ezy::join(ezy::transform(std::forward<Range>(range), ezy::to_string), separator);
}